

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_memcpy(void *dest_,void *src_,size_t units)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t *local_30;
  size_t *src;
  size_t *dest;
  size_t units_local;
  void *src__local;
  void *dest__local;
  
  local_30 = (size_t *)src_;
  src = (size_t *)dest_;
  for (dest = (size_t *)(units << 1); (size_t *)0xf < dest; dest = dest + -2) {
    *src = *local_30;
    src[1] = local_30[1];
    src[2] = local_30[2];
    src[3] = local_30[3];
    src[4] = local_30[4];
    src[5] = local_30[5];
    src[6] = local_30[6];
    src[7] = local_30[7];
    src[8] = local_30[8];
    src[9] = local_30[9];
    src[10] = local_30[10];
    src[0xb] = local_30[0xb];
    src[0xc] = local_30[0xc];
    src[0xd] = local_30[0xd];
    src[0xe] = local_30[0xe];
    src[0xf] = local_30[0xf];
    src = src + 0x10;
    local_30 = local_30 + 0x10;
  }
  switch(dest) {
  case (size_t *)0xe:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0xc:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0xa:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0x8:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0x6:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0x4:
    psVar1 = local_30 + 1;
    psVar2 = src + 1;
    *src = *local_30;
    local_30 = local_30 + 2;
    src = src + 2;
    *psVar2 = *psVar1;
  case (size_t *)0x2:
    *src = *local_30;
    src[1] = local_30[1];
    return;
  default:
    return;
  }
}

Assistant:

static inline void fio_memcpy(void *__restrict dest_, void *__restrict src_,
                              size_t units) {
#if __SIZEOF_INT128__ == 9 /* a 128bit type exists... but tests favor 64bit */
  register __uint128_t *dest = dest_;
  register __uint128_t *src = src_;
#elif SIZE_MAX == 0xFFFFFFFFFFFFFFFF /* 64 bit size_t */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 1;
#elif SIZE_MAX == 0xFFFFFFFF         /* 32 bit size_t */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 2;
#else                                /* unknow... assume 16 bit? */
  register size_t *dest = dest_;
  register size_t *src = src_;
  units = units << 3;
#endif
  while (units >= 16) { /* unroll loop */
    dest[0] = src[0];
    dest[1] = src[1];
    dest[2] = src[2];
    dest[3] = src[3];
    dest[4] = src[4];
    dest[5] = src[5];
    dest[6] = src[6];
    dest[7] = src[7];
    dest[8] = src[8];
    dest[9] = src[9];
    dest[10] = src[10];
    dest[11] = src[11];
    dest[12] = src[12];
    dest[13] = src[13];
    dest[14] = src[14];
    dest[15] = src[15];
    dest += 16;
    src += 16;
    units -= 16;
  }
  switch (units) {
  case 15:
    *(dest++) = *(src++); /* fallthrough */
  case 14:
    *(dest++) = *(src++); /* fallthrough */
  case 13:
    *(dest++) = *(src++); /* fallthrough */
  case 12:
    *(dest++) = *(src++); /* fallthrough */
  case 11:
    *(dest++) = *(src++); /* fallthrough */
  case 10:
    *(dest++) = *(src++); /* fallthrough */
  case 9:
    *(dest++) = *(src++); /* fallthrough */
  case 8:
    *(dest++) = *(src++); /* fallthrough */
  case 7:
    *(dest++) = *(src++); /* fallthrough */
  case 6:
    *(dest++) = *(src++); /* fallthrough */
  case 5:
    *(dest++) = *(src++); /* fallthrough */
  case 4:
    *(dest++) = *(src++); /* fallthrough */
  case 3:
    *(dest++) = *(src++); /* fallthrough */
  case 2:
    *(dest++) = *(src++); /* fallthrough */
  case 1:
    *(dest++) = *(src++);
  }
}